

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O0

void __thiscall
license::CryptoHelperLinux::loadPrivateKey(CryptoHelperLinux *this,string *privateKey)

{
  int len;
  void *buf;
  EVP_PKEY *pEVar1;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  BIO *local_20;
  BIO *bio;
  string *privateKey_local;
  CryptoHelperLinux *this_local;
  
  bio = (BIO *)privateKey;
  privateKey_local = (string *)this;
  if (this->m_pktmp != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)this->m_pktmp);
  }
  this->m_pktmp = (EVP_PKEY *)0x0;
  buf = (void *)std::__cxx11::string::c_str();
  len = std::__cxx11::string::size();
  local_20 = BIO_new_mem_buf(buf,len);
  pEVar1 = PEM_read_bio_PrivateKey
                     (local_20,(EVP_PKEY **)&this->m_pktmp,(undefined1 *)0x0,(void *)0x0);
  this->m_pktmp = (EVP_PKEY *)pEVar1;
  if (this->m_pktmp == (EVP_PKEY *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_60,"Private key [",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bio);
    std::operator+(&local_40,&local_60,"] can\'t be loaded");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  BIO_free(local_20);
  return;
}

Assistant:

void CryptoHelperLinux::loadPrivateKey(const std::string &privateKey) {
	if (m_pktmp) {
		EVP_PKEY_free(m_pktmp);
	}

	m_pktmp = nullptr;
	BIO *bio = BIO_new_mem_buf((void *)(privateKey.c_str()), privateKey.size());
	m_pktmp = PEM_read_bio_PrivateKey(bio, &m_pktmp, NULL, NULL);
	if (!m_pktmp) {
		throw logic_error("Private key [" + privateKey + "] can't be loaded");
	}
	BIO_free(bio);
}